

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,for_statement *s)

{
  statement *s_00;
  expression *peVar1;
  bool bVar2;
  label_set ls;
  completion c;
  _Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  local_100;
  completion local_e8;
  value local_a8;
  value local_80;
  value local_58;
  
  get_labels((label_set *)&local_100,this,&s->super_statement);
  s_00 = (s->init_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
         ._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (s_00 != (statement *)0x0) {
    eval(&local_e8,this,s_00);
    if (local_e8.type != normal) {
      __assert_fail("!c",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3bf,"completion mjs::interpreter::impl::operator()(const for_statement &)");
    }
    get_value(&local_80,this,&local_e8.result);
    value::~value(&local_80);
    value::~value(&local_e8.result);
  }
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  do {
    peVar1 = (s->cond_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    if (peVar1 != (expression *)0x0) {
      eval(&local_a8,this,peVar1);
      get_value((value *)&local_e8,this,&local_a8);
      bVar2 = to_boolean((value *)&local_e8);
      value::~value((value *)&local_e8);
      value::~value(&local_a8);
      if (!bVar2) {
LAB_0011abe3:
        std::
        _Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
        ::~_Vector_base(&local_100);
        return __return_storage_ptr__;
      }
    }
    eval(&local_e8,this,
         (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
    completion::operator=(__return_storage_ptr__,&local_e8);
    value::~value(&local_e8.result);
    bVar2 = handle_completion(__return_storage_ptr__,(label_set *)&local_100);
    if (bVar2) goto LAB_0011abe3;
    peVar1 = (s->iter_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    if (peVar1 != (expression *)0x0) {
      eval((value *)&local_e8,this,peVar1);
      get_value(&local_58,this,(value *)&local_e8);
      value::~value(&local_58);
      value::~value((value *)&local_e8);
    }
  } while( true );
}

Assistant:

completion operator()(const for_statement& s) {
        const auto ls = get_labels(s);
        if (auto is = s.init()) {
            auto c = eval(*is);
            assert(!c); // Expect normal completion
            (void)get_value(c.result);
        }
        completion c{};
        while (!s.cond() || to_boolean(get_value(eval(*s.cond())))) {
            c = eval(s.s());

            if (handle_completion(c, ls)) {
                return c;
            }

            if (s.iter()) {
                (void)get_value(eval(*s.iter()));
            }
        }
        return c;
    }